

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall ColorTest_blue_Test::ColorTest_blue_Test(ColorTest_blue_Test *this)

{
  ColorTest_blue_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ColorTest_blue_Test_00818718;
  return;
}

Assistant:

TEST(ColorTest, blue) {
	color color_value{ 0xFF };
	color color_rgb{ 0, 0, 0xFF };

	EXPECT_EQ(color_value, color_rgb);
	EXPECT_EQ(color_value.value(), 0xFFU);
	EXPECT_EQ(color_value.red(), 0x00);
	EXPECT_EQ(color_value.green(), 0x00);
	EXPECT_EQ(color_value.blue(), 0xFF);
}